

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateViewportPlatformMonitor(ImGuiViewportP *viewport)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  short sVar8;
  undefined4 uVar9;
  float *pfVar10;
  ulong uVar11;
  ulong in_R8;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  iVar4 = (GImGui->PlatformIO).Monitors.Size;
  if ((long)iVar4 < 2) {
    sVar8 = (short)iVar4 + -1;
  }
  else {
    fVar1 = (viewport->super_ImGuiViewport).Pos.x;
    fVar2 = (viewport->super_ImGuiViewport).Pos.y;
    fVar12 = (viewport->super_ImGuiViewport).Size.x + fVar1;
    fVar13 = (viewport->super_ImGuiViewport).Size.y + fVar2;
    fVar14 = (fVar13 - fVar2) * (fVar12 - fVar1) * 0.5;
    if (fVar14 <= 1.0) {
      fVar14 = 1.0;
    }
    uVar9 = 0xffffffff;
    sVar8 = -1;
    if (0.001 < fVar14) {
      pfVar10 = &(((GImGui->PlatformIO).Monitors.Data)->MainSize).y;
      fVar15 = 0.001;
      uVar11 = 1;
      do {
        fVar18 = pfVar10[-3];
        fVar3 = pfVar10[-2];
        fVar16 = ((ImVec2 *)(pfVar10 + -1))->x + fVar18;
        fVar17 = *pfVar10 + fVar3;
        if ((((fVar1 < fVar18) || (fVar2 < fVar3)) || (fVar16 < fVar12)) || (fVar17 < fVar13)) {
          fVar6 = fVar17;
          if (fVar2 <= fVar17) {
            fVar6 = fVar2;
          }
          fVar5 = fVar16;
          if (fVar1 <= fVar16) {
            fVar5 = fVar1;
          }
          if (fVar13 <= fVar17) {
            fVar17 = fVar13;
          }
          if (fVar12 <= fVar16) {
            fVar16 = fVar12;
          }
          fVar18 = ((float)(-(uint)(fVar13 < fVar3) & (uint)fVar3 |
                           ~-(uint)(fVar13 < fVar3) & (uint)fVar17) -
                   (float)(-(uint)(fVar2 < fVar3) & (uint)fVar3 |
                          ~-(uint)(fVar2 < fVar3) & (uint)fVar6)) *
                   ((float)(-(uint)(fVar12 < fVar18) & (uint)fVar18 |
                           ~-(uint)(fVar12 < fVar18) & (uint)fVar16) -
                   (float)(-(uint)(fVar1 < fVar18) & (uint)fVar18 |
                          ~-(uint)(fVar1 < fVar18) & (uint)fVar5));
          if (fVar15 <= fVar18) {
            fVar15 = fVar18;
            uVar9 = (int)(uVar11 - 1);
          }
          bVar7 = false;
        }
        else {
          bVar7 = true;
          in_R8 = uVar11 - 1 & 0xffffffff;
        }
        sVar8 = (short)uVar9;
        if (bVar7) {
          sVar8 = (short)in_R8;
          break;
        }
        if ((ulong)(long)iVar4 <= uVar11) break;
        uVar11 = uVar11 + 1;
        pfVar10 = pfVar10 + 9;
      } while (fVar15 < fVar14);
    }
  }
  viewport->PlatformMonitor = sVar8;
  return;
}

Assistant:

static int ImGui::FindPlatformMonitorForRect(const ImRect& rect)
{
    ImGuiContext& g = *GImGui;

    const int monitor_count = g.PlatformIO.Monitors.Size;
    if (monitor_count <= 1)
        return monitor_count - 1;

    // Use a minimum threshold of 1.0f so a zero-sized rect won't false positive, and will still find the correct monitor given its position.
    // This is necessary for tooltips which always resize down to zero at first.
    const float surface_threshold = ImMax(rect.GetWidth() * rect.GetHeight() * 0.5f, 1.0f);
    int best_monitor_n = -1;
    float best_monitor_surface = 0.001f;

    for (int monitor_n = 0; monitor_n < g.PlatformIO.Monitors.Size && best_monitor_surface < surface_threshold; monitor_n++)
    {
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[monitor_n];
        const ImRect monitor_rect = ImRect(monitor.MainPos, monitor.MainPos + monitor.MainSize);
        if (monitor_rect.Contains(rect))
            return monitor_n;
        ImRect overlapping_rect = rect;
        overlapping_rect.ClipWithFull(monitor_rect);
        float overlapping_surface = overlapping_rect.GetWidth() * overlapping_rect.GetHeight();
        if (overlapping_surface < best_monitor_surface)
            continue;
        best_monitor_surface = overlapping_surface;
        best_monitor_n = monitor_n;
    }
    return best_monitor_n;
}